

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

uint64_t lzma_memusage(lzma_stream *strm)

{
  lzma_ret lVar1;
  uint64_t local_28;
  uint64_t old_memlimit;
  uint64_t memusage;
  lzma_stream *strm_local;
  
  if ((((strm != (lzma_stream *)0x0) && (strm->internal != (lzma_internal *)0x0)) &&
      ((strm->internal->next).memconfig !=
       (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *)0x0)) &&
     (memusage = (uint64_t)strm,
     lVar1 = (*(strm->internal->next).memconfig)
                       ((strm->internal->next).coder,&old_memlimit,&local_28,0), lVar1 == LZMA_OK))
  {
    return old_memlimit;
  }
  return 0;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_memusage(const lzma_stream *strm)
{
	uint64_t memusage;
	uint64_t old_memlimit;

	if (strm == NULL || strm->internal == NULL
			|| strm->internal->next.memconfig == NULL
			|| strm->internal->next.memconfig(
				strm->internal->next.coder,
				&memusage, &old_memlimit, 0) != LZMA_OK)
		return 0;

	return memusage;
}